

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O1

void Common::refactor(TaskHandle *head)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  int iVar4;
  TaskHandle task;
  TaskHandle tail;
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_58 = (head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  local_48 = (element_type *)0x0;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  (head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  local_50._M_pi = p_Var1;
  local_38 = p_Var1;
  if (local_58 != (element_type *)0x0) {
    this = &(head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_refcount;
    do {
      iVar4 = std::__cxx11::string::compare((char *)&local_58->name);
      if (iVar4 != 0) {
        iVar4 = std::__cxx11::string::compare((char *)&local_58->name);
        if (iVar4 != 0) {
          if (local_48 == (element_type *)0x0) {
            (head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = local_58;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(this,&local_50);
            local_48 = (head->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&_Stack_40,this);
            (local_58->prev).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            p_Var1 = (local_58->prev).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
            (local_58->prev).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
            }
          }
          else {
            (local_48->next).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_58;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (&(local_48->next).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,&local_50);
            (local_58->prev).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_48;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (&(local_58->prev).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,&_Stack_40);
            local_48 = local_58;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&_Stack_40,&local_50);
          }
        }
      }
      peVar3 = (local_58->next).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_50,
                 &(local_58->next).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      local_58 = peVar3;
    } while (peVar3 != (element_type *)0x0);
  }
  if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
  }
  p_Var2 = local_38;
  (local_48->next).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  p_Var1 = (local_48->next).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (local_48->next).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
  }
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  return;
}

Assistant:

static void refactor(TaskHandle &head) {
        TaskHandle loop_head = head, tail;
        head = nullptr;
        LOOP(task, loop_head) {
            if (not (task->isDealloc() or task->isShare())) {
                if (not tail) {
                    tail = head = task;
                    task->prev = nullptr;
                } else {
                    tail->next = task;
                    task->prev = tail;
                    tail = task;
                }
            }
        }
        tail->next = nullptr;
    }